

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::outsubfaces(tetgenmesh *this,tetgenio *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  int local_4e4;
  int local_4d4;
  int t1ver;
  int i;
  int o2index;
  int highorderindex;
  point pp [3];
  point *extralist;
  triface workface;
  int facenumber;
  int neigh2;
  int neigh1;
  int shift;
  int firstindex;
  int marker;
  point tapex;
  point tdest;
  point torg;
  face faceloop;
  triface abuttingtet;
  int local_440;
  int index2;
  int index1;
  int index;
  int *emlist;
  int *elist;
  char facefilename [1024];
  FILE *local_20;
  FILE *outfile;
  tetgenio *out_local;
  tetgenmesh *this_local;
  
  local_20 = (FILE *)0x0;
  emlist = (int *)0x0;
  _index1 = (int *)0x0;
  index2 = 0;
  local_440 = 0;
  abuttingtet._12_4_ = 0;
  triface::triface((triface *)&faceloop.shver);
  face::face((face *)&torg);
  shift = 0;
  facenumber = 0;
  workface._12_4_ = 0;
  triface::triface((triface *)&extralist);
  memset(&o2index,0,0x18);
  t1ver = 0;
  if (out == (tetgenio *)0x0) {
    strcpy((char *)&elist,this->b->outfilename);
    strcat((char *)&elist,".face");
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",&elist);
    }
    else {
      printf("Writing faces.\n");
    }
  }
  if (out == (tetgenio *)0x0) {
    local_20 = fopen((char *)&elist,"w");
    if (local_20 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",&elist);
      terminatetetgen(this,3);
    }
    fprintf(local_20,"%ld  %d\n",this->subfaces->items,(ulong)((this->b->nobound != 0 ^ 0xffU) & 1))
    ;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->subfaces->items * 3;
    uVar10 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    piVar11 = (int *)operator_new__(uVar10);
    out->trifacelist = piVar11;
    if (out->trifacelist == (int *)0x0) {
      terminatetetgen(this,1);
    }
    if (this->b->order == 2) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->subfaces->items * 3;
      uVar10 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      piVar11 = (int *)operator_new__(uVar10);
      out->o2facelist = piVar11;
    }
    if (this->b->nobound == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = this->subfaces->items;
      uVar10 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      piVar11 = (int *)operator_new__(uVar10);
      out->trifacemarkerlist = piVar11;
      if (out->trifacemarkerlist == (int *)0x0) {
        terminatetetgen(this,1);
      }
    }
    if (1 < this->b->neighout) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = this->subfaces->items << 1;
      uVar10 = SUB168(auVar4 * ZEXT816(4),0);
      if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      piVar11 = (int *)operator_new__(uVar10);
      out->face2tetlist = piVar11;
      if (out->face2tetlist == (int *)0x0) {
        terminatetetgen(this,1);
      }
    }
    out->numberoftrifaces = (int)this->subfaces->items;
    emlist = out->trifacelist;
    _index1 = out->trifacemarkerlist;
  }
  if (this->b->zeroindex == 0) {
    local_4e4 = this->in->firstnumber;
  }
  else {
    local_4e4 = 0;
  }
  neigh2 = 0;
  if ((this->in->firstnumber == 1) && (local_4e4 == 0)) {
    neigh2 = 1;
  }
  memorypool::traversalinit(this->subfaces);
  torg = (point)shellfacetraverse(this,this->subfaces);
  workface.ver = local_4e4;
  while (torg != (point)0x0) {
    stpivot(this,(face *)&torg,(triface *)&faceloop.shver);
    if ((faceloop._8_8_ != 0) && (bVar5 = ishulltet(this,(triface *)&faceloop.shver), bVar5)) {
      decode(this,*(tetrahedron *)(faceloop._8_8_ + (long)(int)((uint)abuttingtet.tet & 3) * 8),
             (triface *)&faceloop.shver);
      abuttingtet.tet._0_4_ = fsymtbl[(int)(uint)abuttingtet.tet][(int)(uint)abuttingtet.tet];
    }
    if (faceloop._8_8_ == 0) {
      tdest = sorg(this,(face *)&torg);
      tapex = sdest(this,(face *)&torg);
      _firstindex = sapex(this,(face *)&torg);
      if (this->b->order == 2) {
        _o2index = tdest;
        pp[0] = tapex;
        pp[1] = _firstindex;
      }
    }
    else {
      tdest = org(this,(triface *)&faceloop.shver);
      tapex = dest(this,(triface *)&faceloop.shver);
      _firstindex = apex(this,(triface *)&faceloop.shver);
      if (this->b->order == 2) {
        pp[2] = *(point *)(faceloop._8_8_ + 0x58);
        triface::operator=((triface *)&extralist,(triface *)&faceloop.shver);
        for (local_4d4 = 0; local_4d4 < 3; local_4d4 = local_4d4 + 1) {
          *(double *)(&o2index + (long)local_4d4 * 2) = pp[2][ver2edge[(int)workface.tet]];
          enextself(this,(triface *)&extralist);
        }
      }
    }
    if (this->b->nobound == 0) {
      shift = shellmark(this,(face *)&torg);
    }
    if (1 < this->b->neighout) {
      facenumber = -1;
      workface._12_4_ = 0xffffffff;
      stpivot(this,(face *)&torg,(triface *)&faceloop.shver);
      if (faceloop._8_8_ != 0) {
        bVar5 = ishulltet(this,(triface *)&faceloop.shver);
        if (!bVar5) {
          facenumber = elemindex(this,(tetrahedron *)faceloop._8_8_);
        }
        decode(this,*(tetrahedron *)(faceloop._8_8_ + (long)(int)((uint)abuttingtet.tet & 3) * 8),
               (triface *)&faceloop.shver);
        abuttingtet.tet._0_4_ = fsymtbl[(int)(uint)abuttingtet.tet][(int)(uint)abuttingtet.tet];
        bVar5 = ishulltet(this,(triface *)&faceloop.shver);
        if (!bVar5) {
          workface._12_4_ = elemindex(this,(tetrahedron *)faceloop._8_8_);
        }
      }
    }
    iVar9 = workface.ver;
    if (out == (tetgenio *)0x0) {
      iVar6 = pointmark(this,tdest);
      iVar7 = pointmark(this,tapex);
      iVar8 = pointmark(this,_firstindex);
      fprintf(local_20,"%5d   %4d  %4d  %4d",(ulong)(uint)iVar9,(ulong)(uint)(iVar6 - neigh2),
              (ulong)(uint)(iVar7 - neigh2),(ulong)(uint)(iVar8 - neigh2));
      if (this->b->order == 2) {
        iVar9 = pointmark(this,_o2index);
        iVar6 = pointmark(this,pp[0]);
        iVar7 = pointmark(this,pp[1]);
        fprintf(local_20,"  %4d  %4d  %4d",(ulong)(uint)(iVar9 - neigh2),
                (ulong)(uint)(iVar6 - neigh2),(ulong)(uint)(iVar7 - neigh2));
      }
      if (this->b->nobound == 0) {
        fprintf(local_20,"    %d",(ulong)(uint)shift);
      }
      if (1 < this->b->neighout) {
        fprintf(local_20,"    %5d  %5d",(ulong)(uint)facenumber,(ulong)(uint)workface._12_4_);
      }
      fprintf(local_20,"\n");
    }
    else {
      iVar9 = pointmark(this,tdest);
      emlist[index2] = iVar9 - neigh2;
      iVar9 = pointmark(this,tapex);
      iVar6 = index2 + 2;
      emlist[index2 + 1] = iVar9 - neigh2;
      iVar9 = pointmark(this,_firstindex);
      index2 = index2 + 3;
      emlist[iVar6] = iVar9 - neigh2;
      if (this->b->order == 2) {
        iVar9 = pointmark(this,_o2index);
        out->o2facelist[t1ver] = iVar9 - neigh2;
        iVar9 = pointmark(this,pp[0]);
        iVar6 = t1ver + 2;
        out->o2facelist[t1ver + 1] = iVar9 - neigh2;
        iVar9 = pointmark(this,pp[1]);
        t1ver = t1ver + 3;
        out->o2facelist[iVar6] = iVar9 - neigh2;
      }
      if (this->b->nobound == 0) {
        _index1[local_440] = shift;
        local_440 = local_440 + 1;
      }
      if (1 < this->b->neighout) {
        iVar9 = abuttingtet._12_4_ + 1;
        out->face2tetlist[(int)abuttingtet._12_4_] = facenumber;
        abuttingtet._12_4_ = abuttingtet._12_4_ + 2;
        out->face2tetlist[iVar9] = workface._12_4_;
      }
    }
    workface.ver = workface.ver + 1;
    torg = (point)shellfacetraverse(this,this->subfaces);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(local_20,"# Generated by %s\n",this->b->commandline);
    fclose(local_20);
  }
  return;
}

Assistant:

void tetgenmesh::outsubfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  int *elist = NULL;
  int *emlist = NULL;
  int index = 0, index1 = 0, index2 = 0;
  triface abuttingtet;
  face faceloop;
  point torg, tdest, tapex;
  int marker = 0;
  int firstindex, shift;
  int neigh1 = 0, neigh2 = 0;
  int facenumber;

  // For -o2 option.
  triface workface;
  point *extralist, pp[3] = {0,0,0}; 
  int highorderindex = 11;
  int o2index = 0, i;

  int t1ver; // used by fsymself()

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 3);
    }
    // Number of subfaces.
    fprintf(outfile, "%ld  %d\n", subfaces->items, !b->nobound);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[subfaces->items * 3];
    if (out->trifacelist == (int *) NULL) {
      terminatetetgen(this, 1);
    }
    if (b->order == 2) {
      out->o2facelist = new int[subfaces->items * 3];
    }
    if (!b->nobound) {
      // Allocate memory for 'trifacemarkerlist'.
      out->trifacemarkerlist = new int[subfaces->items];
      if (out->trifacemarkerlist == (int *) NULL) {
        terminatetetgen(this, 1);
      }
    }
    if (b->neighout > 1) {
      // '-nn' switch.
      out->face2tetlist = new int[subfaces->items * 2];
      if (out->face2tetlist == (int *) NULL) {
        terminatetetgen(this, 1);
      }
    }
    out->numberoftrifaces = subfaces->items;
    elist = out->trifacelist;
    emlist = out->trifacemarkerlist;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  subfaces->traversalinit();
  faceloop.sh = shellfacetraverse(subfaces);
  facenumber = firstindex; // in->firstnumber;
  while (faceloop.sh != (shellface *) NULL) {
    stpivot(faceloop, abuttingtet);
    // If there is a tetrahedron containing this subface, orient it so
    //   that the normal of this face points to inside of the volume by
    //   right-hand rule.
    if (abuttingtet.tet != NULL) {
      if (ishulltet(abuttingtet)) {
        fsymself(abuttingtet);
      }
    }
    if (abuttingtet.tet != NULL) {
      torg = org(abuttingtet);
      tdest = dest(abuttingtet);
      tapex = apex(abuttingtet);
      if (b->order == 2) { // -o2
        // Get the three extra vertices on edges.
        extralist = (point *) (abuttingtet.tet[highorderindex]);
        workface = abuttingtet;
        for (i = 0; i < 3; i++) {
          pp[i] = extralist[ver2edge[workface.ver]];
          enextself(workface);
        }
      }
    } else {
      // This may happen when only a surface mesh be generated.
      torg = sorg(faceloop);
      tdest = sdest(faceloop);
      tapex = sapex(faceloop);
      if (b->order == 2) { // -o2
        // There is no extra node list available.
        pp[0] = torg;
        pp[1] = tdest;
        pp[2] = tapex;
      }
    }
    if (!b->nobound) {
      marker = shellmark(faceloop);
    }
    if (b->neighout > 1) {
      // '-nn' switch. Output adjacent tets indices.
      neigh1 = -1;
      neigh2 = -1;
      stpivot(faceloop, abuttingtet);
      if (abuttingtet.tet != NULL) {
        if (!ishulltet(abuttingtet)) {
          neigh1 = elemindex(abuttingtet.tet);
        }
        fsymself(abuttingtet);
        if (!ishulltet(abuttingtet)) {
          neigh2 = elemindex(abuttingtet.tet);
        }
      }
    }
    if (out == (tetgenio *) NULL) {
      fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
              pointmark(torg) - shift, pointmark(tdest) - shift,
              pointmark(tapex) - shift);
      if (b->order == 2) { // -o2
        fprintf(outfile, "  %4d  %4d  %4d", pointmark(pp[0]) - shift, 
                pointmark(pp[1]) - shift, pointmark(pp[2]) - shift);
      }
      if (!b->nobound) {
        fprintf(outfile, "    %d", marker);
      }
      if (b->neighout > 1) {
        fprintf(outfile, "    %5d  %5d", neigh1, neigh2);
      }
      fprintf(outfile, "\n");
    } else {
      // Output three vertices of this face;
      elist[index++] = pointmark(torg) - shift;
      elist[index++] = pointmark(tdest) - shift;
      elist[index++] = pointmark(tapex) - shift;
      if (b->order == 2) { // -o2
        out->o2facelist[o2index++] = pointmark(pp[0]) - shift;
        out->o2facelist[o2index++] = pointmark(pp[1]) - shift;
        out->o2facelist[o2index++] = pointmark(pp[2]) - shift;
      }
      if (!b->nobound) {
        emlist[index1++] = marker;
      }
      if (b->neighout > 1) {
        out->face2tetlist[index2++] = neigh1;
        out->face2tetlist[index2++] = neigh2;
      }
    }
    facenumber++;
    faceloop.sh = shellfacetraverse(subfaces);
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}